

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

int __thiscall ON_Material::DeleteTexture(ON_Material *this,wchar_t *filename,TYPE type)

{
  bool bVar1;
  int iVar2;
  ON_wString *this_00;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  
  uVar4 = (this->m_textures).super_ON_ClassArray<ON_Texture>.m_count;
  uVar3 = (ulong)uVar4;
  if (type == no_texture_type && filename == (wchar_t *)0x0) {
    ON_ClassArray<ON_Texture>::SetCapacity(&(this->m_textures).super_ON_ClassArray<ON_Texture>,0);
  }
  else if ((int)uVar4 < 1) {
    uVar4 = 0;
  }
  else {
    lVar5 = uVar3 * 0x200 + -0x1d8;
    uVar4 = 0;
    do {
      if ((type == no_texture_type) ||
         (*(TYPE *)((((this->m_textures).super_ON_ClassArray<ON_Texture>.m_a)->
                    m_image_file_reference).m_recent_content_hash.m_sha1_content_hash.m_digest +
                   lVar5 + 8) == type)) {
        if (filename != (wchar_t *)0x0) {
          this_00 = ON_FileReference::FullPath
                              ((ON_FileReference *)
                               ((long)&((ON_Texture *)
                                       (&((ON_Texture *)
                                         (&((ON_Texture *)
                                           (&((this->m_textures).super_ON_ClassArray<ON_Texture>.m_a
                                             )->m_texture_id + -1))->m_texture_id + -1))->
                                         m_texture_id + -1))->m_texture_id +
                               lVar5 + 0xfffffffffffffff0U));
          iVar2 = ON_wString::ComparePath(this_00,filename);
          if (iVar2 != 0) goto LAB_004d3da0;
        }
        ON_ClassArray<ON_Texture>::Remove
                  (&(this->m_textures).super_ON_ClassArray<ON_Texture>,(int)uVar3 + -1);
        uVar4 = uVar4 + 1;
      }
LAB_004d3da0:
      lVar5 = lVar5 + -0x200;
      bVar1 = 1 < uVar3;
      uVar3 = uVar3 - 1;
    } while (bVar1);
  }
  return uVar4;
}

Assistant:

int ON_Material::DeleteTexture(const wchar_t* filename,ON_Texture::TYPE type )
{
  int deleted_count = 0;
  int i;

  if ( !filename && type == ON_Texture::TYPE::no_texture_type )
  {
    deleted_count = m_textures.Count();
    m_textures.Destroy();
  }
  else
  {
    for ( i = m_textures.Count()-1; i >= 0; i--)
    {
      if ( type != ON_Texture::TYPE::no_texture_type && type != m_textures[i].m_type )
        continue;
      if ( filename && m_textures[i].m_image_file_reference.FullPath().ComparePath(filename) )
        continue;
      m_textures.Remove(i);
      deleted_count++;
    }
  }
  return deleted_count;
}